

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O0

void __thiscall
Js::CompoundString::CopyVirtual
          (CompoundString *this,char16 *buffer,StringCopyInfoStack *nestedStringTreeCopyInfos,
          byte recursionDepth)

{
  code *pcVar1;
  StringCopyInfo copyInfo;
  ScriptContext **ppSVar2;
  StringCopyInfoStack *this_00;
  bool bVar3;
  charcount_t cVar4;
  uint uVar5;
  CharCount CVar6;
  undefined4 *puVar7;
  Block **ppBVar8;
  void **ppvVar9;
  char16 *pcVar10;
  ulong uVar11;
  char16 *local_f0;
  CharCount local_e4;
  Type local_c8;
  char16 *local_b8;
  char16 *blockChars;
  Block *previousBlock;
  undefined1 auStack_a0 [4];
  CharCount blockCharLength;
  char16 *local_98;
  bool local_90;
  undefined7 uStack_8f;
  charcount_t local_84;
  JavascriptString *pJStack_80;
  CharCount copyCharLength_1;
  JavascriptString *s_1;
  CharCount copyCharLength;
  CharCount startIndex;
  JavascriptString *s;
  void *pointer2;
  void *pointer;
  Type *pTStack_50;
  CharCount pointerIndex;
  Type *blockPointers;
  Block *block;
  Block *lastBlock;
  Type local_30;
  CharCount remainingCharLengthToCopy;
  CharCount directCharLength;
  bool hasOnlyDirectChars;
  CharCount totalCharLength;
  byte recursionDepth_local;
  StringCopyInfoStack *nestedStringTreeCopyInfos_local;
  char16 *buffer_local;
  CompoundString *this_local;
  
  hasOnlyDirectChars = (bool)recursionDepth;
  _totalCharLength = nestedStringTreeCopyInfos;
  nestedStringTreeCopyInfos_local = (StringCopyInfoStack *)buffer;
  buffer_local = (char16 *)this;
  bVar3 = JavascriptString::IsFinalized((JavascriptString *)this);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x41e,"(!IsFinalized())","!IsFinalized()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (nestedStringTreeCopyInfos_local == (StringCopyInfoStack *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x41f,"(buffer)","buffer");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  directCharLength = JavascriptString::GetLength((JavascriptString *)this);
  if (directCharLength != 0) {
    if (directCharLength == 1) {
      bVar3 = HasOnlyDirectChars(this);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                    ,0x428,"(HasOnlyDirectChars())","HasOnlyDirectChars()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      CVar6 = LastBlockCharLength(this);
      if (CVar6 != 1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                    ,0x429,"(LastBlockCharLength() == 1)",
                                    "LastBlockCharLength() == 1");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      pcVar10 = LastBlockChars(this);
      *(char16 *)&nestedStringTreeCopyInfos_local->scriptContext = *pcVar10;
    }
    else {
      remainingCharLengthToCopy._3_1_ = HasOnlyDirectChars(this);
      if ((bool)remainingCharLengthToCopy._3_1_) {
        local_c8 = directCharLength;
      }
      else {
        local_c8 = this->directCharLength;
      }
      local_30 = local_c8;
      lastBlock._4_4_ = directCharLength;
      ppBVar8 = Memory::WriteBarrierPtr::operator_cast_to_Block__
                          ((WriteBarrierPtr *)&this->lastBlock);
      blockPointers = (Type *)*ppBVar8;
      block = (Block *)blockPointers;
      pTStack_50 = LastBlockPointers(this);
      pointer._4_4_ = LastBlockPointerLength(this);
      while (local_30 < lastBlock._4_4_) {
        while (pointer._4_4_ == 0) {
          if (blockPointers == (Type *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x43b,"(block)","block");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          blockPointers = (Type *)Block::Previous((Block *)blockPointers);
          if ((Block *)blockPointers == (Block *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x43d,"(block)","block");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          pTStack_50 = Block::Pointers((Block *)blockPointers);
          pointer._4_4_ = Block::PointerLength((Block *)blockPointers);
        }
        pointer._4_4_ = pointer._4_4_ - 1;
        ppvVar9 = Memory::WriteBarrierPtr::operator_cast_to_void__
                            ((WriteBarrierPtr *)(pTStack_50 + pointer._4_4_));
        pointer2 = *ppvVar9;
        bVar3 = IsPackedInfo(pointer2);
        if (bVar3) {
          if (pointer._4_4_ == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x445,"(pointerIndex != 0)","pointerIndex != 0");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          pointer._4_4_ = pointer._4_4_ - 1;
          ppvVar9 = Memory::WriteBarrierPtr::operator_cast_to_void__
                              ((WriteBarrierPtr *)(pTStack_50 + pointer._4_4_));
          s = (JavascriptString *)*ppvVar9;
          bVar3 = IsPackedInfo(s);
          if (bVar3) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x449,"(!IsPackedInfo(pointer2))","!IsPackedInfo(pointer2)"
                                       );
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          _copyCharLength = VarTo<Js::JavascriptString>(s);
          s = (JavascriptString *)0x0;
          UnpackSubstringInfo(pointer2,(void *)0x0,(CharCount *)((long)&s_1 + 4),(CharCount *)&s_1);
          uVar5 = s_1._4_4_;
          cVar4 = JavascriptString::GetLength(_copyCharLength);
          if (cVar4 < uVar5) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x459,"(startIndex <= s->GetLength())",
                                        "startIndex <= s->GetLength()");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          uVar5 = (uint)s_1;
          cVar4 = JavascriptString::GetLength(_copyCharLength);
          if (cVar4 - s_1._4_4_ < uVar5) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x45a,"(copyCharLength <= s->GetLength() - startIndex)",
                                        "copyCharLength <= s->GetLength() - startIndex");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          if (lastBlock._4_4_ < (uint)s_1) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x45c,"(remainingCharLengthToCopy >= copyCharLength)",
                                        "remainingCharLengthToCopy >= copyCharLength");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          lastBlock._4_4_ = lastBlock._4_4_ - (uint)s_1;
          uVar11 = (ulong)lastBlock._4_4_;
          ppSVar2 = &nestedStringTreeCopyInfos_local->scriptContext;
          pcVar10 = JavascriptString::GetString(_copyCharLength);
          JavascriptString::CopyHelper
                    ((char16 *)((long)ppSVar2 + uVar11 * 2),pcVar10 + s_1._4_4_,(uint)s_1);
        }
        else {
          pJStack_80 = VarTo<Js::JavascriptString>(pointer2);
          local_84 = JavascriptString::GetLength(pJStack_80);
          if (lastBlock._4_4_ < local_84) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x465,"(remainingCharLengthToCopy >= copyCharLength)",
                                        "remainingCharLengthToCopy >= copyCharLength");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          lastBlock._4_4_ = lastBlock._4_4_ - local_84;
          if ((hasOnlyDirectChars == true) &&
             (uVar5 = (*(pJStack_80->super_RecyclableObject).super_FinalizableObject.
                        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6a])(),
             this_00 = _totalCharLength, (uVar5 & 1) != 0)) {
            StringCopyInfo::StringCopyInfo
                      ((StringCopyInfo *)auStack_a0,pJStack_80,
                       (char16 *)
                       ((long)&nestedStringTreeCopyInfos_local->scriptContext +
                       (ulong)lastBlock._4_4_ * 2));
            copyInfo.destinationBuffer = local_98;
            copyInfo.sourceString = _auStack_a0;
            copyInfo.isInitialized = local_90;
            copyInfo._17_7_ = uStack_8f;
            StringCopyInfoStack::Push(this_00,copyInfo);
          }
          else {
            if (3 < hasOnlyDirectChars) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                          ,0x470,"(recursionDepth <= MaxCopyRecursionDepth)",
                                          "recursionDepth <= MaxCopyRecursionDepth");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            JavascriptString::Copy
                      (pJStack_80,
                       (char16 *)
                       ((long)&nestedStringTreeCopyInfos_local->scriptContext +
                       (ulong)lastBlock._4_4_ * 2),_totalCharLength,hasOnlyDirectChars + '\x01');
          }
        }
      }
      if (lastBlock._4_4_ != local_30) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                    ,0x476,"(remainingCharLengthToCopy == directCharLength)",
                                    "remainingCharLengthToCopy == directCharLength");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      if (lastBlock._4_4_ != 0) {
        if (pointer._4_4_ == 0) {
          if (blockPointers == (Type *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x47f,"(block)","block");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          blockPointers = (Type *)Block::Previous((Block *)blockPointers);
          if ((Block *)blockPointers == (Block *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x481,"(block)","block");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          previousBlock._4_4_ = Block::CharLength((Block *)blockPointers);
        }
        else if ((remainingCharLengthToCopy._3_1_ & 1) == 0) {
          previousBlock._4_4_ = lastBlock._4_4_;
          if (blockPointers != (Type *)0x0) {
            for (blockChars = (char16 *)Block::Previous((Block *)blockPointers);
                blockChars != (char16 *)0x0;
                blockChars = (char16 *)Block::Previous((Block *)blockChars)) {
              CVar6 = Block::CharLength((Block *)blockChars);
              if (previousBlock._4_4_ < CVar6) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 1;
                bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                            ,0x494,
                                            "(blockCharLength >= previousBlock->CharLength())",
                                            "blockCharLength >= previousBlock->CharLength()");
                if (!bVar3) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 0;
              }
              CVar6 = Block::CharLength((Block *)blockChars);
              previousBlock._4_4_ = previousBlock._4_4_ - CVar6;
            }
          }
          CVar6 = Block::PointerLengthFromCharLength(previousBlock._4_4_);
          if (CVar6 != pointer._4_4_) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x498,
                                        "(Block::PointerLengthFromCharLength(blockCharLength) == pointerIndex)"
                                        ,
                                        "Block::PointerLengthFromCharLength(blockCharLength) == pointerIndex"
                                       );
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
        }
        else {
          if ((Block *)blockPointers == block) {
            local_e4 = LastBlockCharLength(this);
          }
          else {
            local_e4 = Block::CharLength((Block *)blockPointers);
          }
          previousBlock._4_4_ = local_e4;
        }
        if ((Block *)blockPointers == block) {
          local_f0 = LastBlockChars(this);
        }
        else {
          local_f0 = Block::Chars((Block *)blockPointers);
        }
        local_b8 = local_f0;
        do {
          if (previousBlock._4_4_ != 0) {
            if (lastBlock._4_4_ < previousBlock._4_4_) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                          ,0x4a1,"(remainingCharLengthToCopy >= blockCharLength)",
                                          "remainingCharLengthToCopy >= blockCharLength");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            lastBlock._4_4_ = lastBlock._4_4_ - previousBlock._4_4_;
            js_wmemcpy_s((char16 *)
                         ((long)&nestedStringTreeCopyInfos_local->scriptContext +
                         (ulong)lastBlock._4_4_ * 2),(ulong)previousBlock._4_4_,local_b8,
                         (ulong)previousBlock._4_4_);
            if (lastBlock._4_4_ == 0) break;
          }
          if (blockPointers == (Type *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x4a9,"(block)","block");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          blockPointers = (Type *)Block::Previous((Block *)blockPointers);
          if ((Block *)blockPointers == (Block *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x4ab,"(block)","block");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          local_b8 = Block::Chars((Block *)blockPointers);
          previousBlock._4_4_ = Block::CharLength((Block *)blockPointers);
        } while( true );
      }
      if (blockPointers != (Type *)0x0) {
        while (blockPointers = (Type *)Block::Previous((Block *)blockPointers),
              (Block *)blockPointers != (Block *)0x0) {
          CVar6 = Block::CharLength((Block *)blockPointers);
          if (CVar6 != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x4ba,"(block->CharLength() == 0)",
                                        "block->CharLength() == 0");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
        }
        blockPointers = (Type *)0x0;
      }
      if (lastBlock._4_4_ != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                    ,0x4bf,"(remainingCharLengthToCopy == 0)",
                                    "remainingCharLengthToCopy == 0");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
    }
  }
  return;
}

Assistant:

void CompoundString::CopyVirtual(
        _Out_writes_(m_charLength) char16 *const buffer,
        StringCopyInfoStack &nestedStringTreeCopyInfos,
        const byte recursionDepth)
    {
        Assert(!IsFinalized());
        Assert(buffer);

        const CharCount totalCharLength = GetLength();
        switch(totalCharLength)
        {
            case 0:
                return;

            case 1:
                Assert(HasOnlyDirectChars());
                Assert(LastBlockCharLength() == 1);

                buffer[0] = LastBlockChars()[0];
                return;
        }

        // Copy buffers from string pointers
        const bool hasOnlyDirectChars = HasOnlyDirectChars();
        const CharCount directCharLength = hasOnlyDirectChars ? totalCharLength : this->directCharLength;
        CharCount remainingCharLengthToCopy = totalCharLength;
        const Block *const lastBlock = this->lastBlock;
        const Block *block = lastBlock;
        Field(void*) const *blockPointers = LastBlockPointers();
        CharCount pointerIndex = LastBlockPointerLength();
        while(remainingCharLengthToCopy > directCharLength)
        {
            while(pointerIndex == 0)
            {
                Assert(block);
                block = block->Previous();
                Assert(block);
                blockPointers = (Field(void*) const *)block->Pointers();
                pointerIndex = block->PointerLength();
            }

            void *const pointer = blockPointers[--pointerIndex];
            if(IsPackedInfo(pointer))
            {
                Assert(pointerIndex != 0);
                void *pointer2 = blockPointers[--pointerIndex];
                JavascriptString *s;
    #if defined(TARGET_64)
                Assert(!IsPackedInfo(pointer2));
    #else
                if(IsPackedInfo(pointer2))
                {
                    Assert(pointerIndex != 0);
                    s = VarTo<JavascriptString>(blockPointers[--pointerIndex]);
                }
                else
    #endif
                {
                    s = VarTo<JavascriptString>(pointer2);
                    pointer2 = nullptr;
                }

                CharCount startIndex, copyCharLength;
                UnpackSubstringInfo(pointer, pointer2, &startIndex, &copyCharLength);
                Assert(startIndex <= s->GetLength());
                Assert(copyCharLength <= s->GetLength() - startIndex);

                Assert(remainingCharLengthToCopy >= copyCharLength);
                remainingCharLengthToCopy -= copyCharLength;
                CopyHelper(&buffer[remainingCharLengthToCopy], &s->GetString()[startIndex], copyCharLength);
            }
            else
            {
                JavascriptString *const s = VarTo<JavascriptString>(pointer);
                const CharCount copyCharLength = s->GetLength();

                Assert(remainingCharLengthToCopy >= copyCharLength);
                remainingCharLengthToCopy -= copyCharLength;
                if(recursionDepth == MaxCopyRecursionDepth && s->IsTree())
                {
                    // Don't copy nested string trees yet, as that involves a recursive call, and the recursion can become
                    // excessive. Just collect the nested string trees and the buffer location where they should be copied, and
                    // the caller can deal with those after returning.
                    nestedStringTreeCopyInfos.Push(StringCopyInfo(s, &buffer[remainingCharLengthToCopy]));
                }
                else
                {
                    Assert(recursionDepth <= MaxCopyRecursionDepth);
                    s->Copy(&buffer[remainingCharLengthToCopy], nestedStringTreeCopyInfos, recursionDepth + 1);
                }
            }
        }

        Assert(remainingCharLengthToCopy == directCharLength);
        if(remainingCharLengthToCopy != 0)
        {
            // Determine the number of direct chars in the current block
            CharCount blockCharLength;
            if(pointerIndex == 0)
            {
                // The string switched to pointer mode at the beginning of the current block, or the string never switched to
                // pointer mode and the last block is empty. In either case, direct chars span to the end of the previous block.
                Assert(block);
                block = block->Previous();
                Assert(block);
                blockCharLength = block->CharLength();
            }
            else if(hasOnlyDirectChars)
            {
                // The string never switched to pointer mode, so the current block's char length is where direct chars end
                blockCharLength = block == lastBlock ? LastBlockCharLength() : block->CharLength();
            }
            else
            {
                // The string switched to pointer mode somewhere in the middle of the current block. To determine where direct
                // chars end in this block, all previous blocks are scanned and their char lengths discounted.
                blockCharLength = remainingCharLengthToCopy;
                if(block)
                {
                    for(const Block *previousBlock = block->Previous();
                        previousBlock;
                        previousBlock = previousBlock->Previous())
                    {
                        Assert(blockCharLength >= previousBlock->CharLength());
                        blockCharLength -= previousBlock->CharLength();
                    }
                }
                Assert(Block::PointerLengthFromCharLength(blockCharLength) == pointerIndex);
            }

            // Copy direct chars
            const char16 *blockChars = block == lastBlock ? LastBlockChars() : block->Chars();
            while(true)
            {
                if(blockCharLength != 0)
                {
                    Assert(remainingCharLengthToCopy >= blockCharLength);
                    remainingCharLengthToCopy -= blockCharLength;
                    // SWB: this is copying "direct chars" and there should be no pointers here. No write barrier needed.
                    js_wmemcpy_s(&buffer[remainingCharLengthToCopy], blockCharLength, blockChars, blockCharLength);
                    if(remainingCharLengthToCopy == 0)
                        break;
                }

                Assert(block);
                block = block->Previous();
                Assert(block);
                blockChars = block->Chars();
                blockCharLength = block->CharLength();
            }
        }

    #if DBG
        // Verify that all nonempty blocks have been visited
        if(block)
        {
            while(true)
            {
                block = block->Previous();
                if(!block)
                    break;
                Assert(block->CharLength() == 0);
            }
        }
    #endif

        Assert(remainingCharLengthToCopy == 0);
    }